

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O0

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::visitLoop
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this,Loop *curr)

{
  bool bVar1;
  BasicType local_1c;
  Loop *local_18;
  Loop *curr_local;
  BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this_local;
  
  local_18 = curr;
  curr_local = (Loop *)this;
  emit(this,(Expression *)curr);
  visitPossibleBlockContents(this,local_18->body);
  emitScopeEnd(this,(Expression *)local_18);
  local_1c = unreachable;
  bVar1 = wasm::Type::operator==
                    (&(local_18->super_SpecificExpression<(wasm::Expression::Id)3>).super_Expression
                      .type,&local_1c);
  if (bVar1) {
    emitUnreachable(this);
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitLoop(Loop* curr) {
  emit(curr);
  visitPossibleBlockContents(curr->body);
  emitScopeEnd(curr);
  if (curr->type == Type::unreachable) {
    // we emitted a loop without a return type, so it must not be consumed
    emitUnreachable();
  }
}